

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

void coda_type_done(void)

{
  long *in_FS_OFFSET;
  undefined4 local_c;
  int i;
  
  for (local_c = 0; local_c < 0xb; local_c = local_c + 1) {
    if (*(long *)(*in_FS_OFFSET + -0x1a0 + (long)local_c * 8) != 0) {
      coda_type_release(*(coda_type **)(*in_FS_OFFSET + -0x1a0 + (long)local_c * 8));
    }
    *(undefined8 *)(*in_FS_OFFSET + -0x1a0 + (long)local_c * 8) = 0;
  }
  for (local_c = 0; local_c < 0xb; local_c = local_c + 1) {
    if (*(long *)(*in_FS_OFFSET + -0x140 + (long)local_c * 8) != 0) {
      coda_type_release(*(coda_type **)(*in_FS_OFFSET + -0x140 + (long)local_c * 8));
    }
    *(undefined8 *)(*in_FS_OFFSET + -0x140 + (long)local_c * 8) = 0;
  }
  return;
}

Assistant:

void coda_type_done(void)
{
    int i;

    for (i = 0; i < num_empty_record_singletons; i++)
    {
        if (empty_record_singleton[i] != NULL)
        {
            coda_type_release((coda_type *)empty_record_singleton[i]);
        }
        empty_record_singleton[i] = NULL;
    }
    for (i = 0; i < num_no_data_singletons; i++)
    {
        if (no_data_singleton[i] != NULL)
        {
            coda_type_release((coda_type *)no_data_singleton[i]);
        }
        no_data_singleton[i] = NULL;
    }
}